

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O1

ssize_t Curl_bufq_sipn(bufq *q,size_t max_len,Curl_bufq_reader *reader,void *reader_ctx,
                      CURLcode *err)

{
  buf_chunk *pbVar1;
  ulong uVar2;
  long lVar3;
  ssize_t sVar4;
  CURLcode CVar5;
  ulong uVar6;
  
  *err = CURLE_AGAIN;
  pbVar1 = get_non_full_tail(q);
  if (pbVar1 == (buf_chunk *)0x0) {
    CVar5 = CURLE_AGAIN;
    if (q->chunk_count < q->max_chunks) {
      CVar5 = CURLE_OUT_OF_MEMORY;
    }
    sVar4 = -1;
  }
  else {
    uVar2 = pbVar1->dlen - pbVar1->w_offset;
    if (uVar2 == 0) {
      *err = CURLE_AGAIN;
      lVar3 = -1;
    }
    else {
      uVar6 = max_len;
      if (uVar2 < max_len) {
        uVar6 = uVar2;
      }
      if (max_len == 0) {
        uVar6 = uVar2;
      }
      lVar3 = (*reader)(reader_ctx,(pbVar1->x).data + pbVar1->w_offset,uVar6,err);
      if (0 < lVar3) {
        pbVar1->w_offset = pbVar1->w_offset + lVar3;
      }
    }
    if (lVar3 < 0) {
      return -1;
    }
    if (lVar3 != 0) {
      return lVar3;
    }
    CVar5 = CURLE_OK;
    sVar4 = 0;
  }
  *err = CVar5;
  return sVar4;
}

Assistant:

ssize_t Curl_bufq_sipn(struct bufq *q, size_t max_len,
                       Curl_bufq_reader *reader, void *reader_ctx,
                       CURLcode *err)
{
  struct buf_chunk *tail = NULL;
  ssize_t nread;

  *err = CURLE_AGAIN;
  tail = get_non_full_tail(q);
  if(!tail) {
    if(q->chunk_count < q->max_chunks) {
      *err = CURLE_OUT_OF_MEMORY;
      return -1;
    }
    /* full, blocked */
    *err = CURLE_AGAIN;
    return -1;
  }

  nread = chunk_slurpn(tail, max_len, reader, reader_ctx, err);
  if(nread < 0) {
    return -1;
  }
  else if(nread == 0) {
    /* eof */
    *err = CURLE_OK;
  }
  return nread;
}